

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TexImage2DParamsCase::createTexture(TexImage2DParamsCase *this)

{
  int iVar1;
  int iVar2;
  int rowPitch_00;
  int iVar3;
  TransferFormat TVar4;
  reference pvVar5;
  int local_10c;
  PixelBufferAccess local_100;
  Vector<float,_4> local_d4;
  Vector<float,_4> local_c4;
  undefined1 local_b4 [8];
  Vec4 colorB;
  Vector<float,_4> local_94;
  undefined1 local_84 [8];
  Vec4 colorA;
  Vec4 cBias;
  Vec4 cScale;
  undefined1 local_48 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  deUint32 tex;
  int rowPitch;
  int rowLength;
  int pixelSize;
  deUint32 local_18;
  deUint32 dStack_14;
  TransferFormat transferFmt;
  TexImage2DParamsCase *this_local;
  
  TVar4 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  iVar3 = tcu::TextureFormat::getPixelSize(&(this->super_Texture2DSpecCase).m_texFormat);
  if (this->m_rowLength < 1) {
    local_10c = (this->super_Texture2DSpecCase).m_width;
  }
  else {
    local_10c = this->m_rowLength;
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = deAlign32(local_10c * iVar3,this->m_alignment);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,
             (long)(iVar3 * this->m_skipPixels +
                   data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_ *
                   ((this->super_Texture2DSpecCase).m_height + this->m_skipRows)));
  tcu::operator-((tcu *)(cBias.m_data + 2),&(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax
                 ,&(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(colorA.m_data + 2),
             &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMin);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(colorB.m_data + 2),1.0,0.0,0.0,1.0);
  tcu::operator*((tcu *)&local_94,(Vector<float,_4> *)(colorB.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_84,&local_94,(Vector<float,_4> *)(colorA.m_data + 2));
  tcu::Vector<float,_4>::Vector(&local_d4,0.0,1.0,0.0,1.0);
  tcu::operator*((tcu *)&local_c4,&local_d4,(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator+((tcu *)local_b4,&local_c4,(Vector<float,_4> *)(colorA.m_data + 2));
  rowPitch_00 = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
  iVar1 = (this->super_Texture2DSpecCase).m_width;
  iVar2 = (this->super_Texture2DSpecCase).m_height;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_100,&(this->super_Texture2DSpecCase).m_texFormat,iVar1,iVar2,1,rowPitch_00,0,
             pvVar5 + (long)(this->m_skipPixels * iVar3) +
                      (long)(this->m_skipRows *
                            data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_));
  tcu::fillWithGrid(&local_100,4,(Vec4 *)local_84,(Vec4 *)local_b4);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf2,
             this->m_rowLength);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf3,
             this->m_skipRows);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf4,
             this->m_skipPixels);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,
             this->m_alignment);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)
             &data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,
             (deUint32)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  iVar3 = *(int *)&(this->super_Texture2DSpecCase).field_0xd4;
  iVar1 = (this->super_Texture2DSpecCase).m_width;
  iVar2 = (this->super_Texture2DSpecCase).m_height;
  local_18 = TVar4.format;
  dStack_14 = TVar4.dataType;
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48,0);
  sglr::ContextWrapper::glTexImage2D
            (&(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper,0xde1,0,
             iVar3,iVar1,iVar2,0,local_18,dStack_14,pvVar5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
  return;
}

Assistant:

void createTexture (void)
	{
		glu::TransferFormat		transferFmt		= glu::getTransferFormat(m_texFormat);
		int						pixelSize		= m_texFormat.getPixelSize();
		int						rowLength		= m_rowLength > 0 ? m_rowLength : m_width;
		int						rowPitch		= deAlign32(rowLength*pixelSize, m_alignment);
		deUint32				tex				= 0;
		vector<deUint8>			data;

		DE_ASSERT(m_numLevels == 1);

		// Fill data with grid.
		data.resize(pixelSize * m_skipPixels + rowPitch * (m_height + m_skipRows));
		{
			Vec4	cScale		= m_texFormatInfo.valueMax-m_texFormatInfo.valueMin;
			Vec4	cBias		= m_texFormatInfo.valueMin;
			Vec4	colorA		= Vec4(1.0f, 0.0f, 0.0f, 1.0f)*cScale + cBias;
			Vec4	colorB		= Vec4(0.0f, 1.0f, 0.0f, 1.0f)*cScale + cBias;

			tcu::fillWithGrid(tcu::PixelBufferAccess(m_texFormat, m_width, m_height, 1, rowPitch, 0, &data[0] + m_skipRows*rowPitch + m_skipPixels*pixelSize), 4, colorA, colorB);
		}

		glPixelStorei(GL_UNPACK_ROW_LENGTH,		m_rowLength);
		glPixelStorei(GL_UNPACK_SKIP_ROWS,		m_skipRows);
		glPixelStorei(GL_UNPACK_SKIP_PIXELS,	m_skipPixels);
		glPixelStorei(GL_UNPACK_ALIGNMENT,		m_alignment);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glTexImage2D(GL_TEXTURE_2D, 0, m_internalFormat, m_width, m_height, 0, transferFmt.format, transferFmt.dataType, &data[0]);
	}